

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_debug.cpp
# Opt level: O1

FString __thiscall FGLDebug::SeverityToString(FGLDebug *this,GLenum severity)

{
  char *copyStr;
  
  this->mCurrentLevel = 0x87e02c;
  this->mBreakpointMode = false;
  *(undefined3 *)&this->field_0x5 = 0;
  FString::NullString.RefCount = FString::NullString.RefCount + 1;
  if ((int)severity < 0x9147) {
    if (severity == 0x826b) {
      copyStr = "notification";
    }
    else {
      if (severity != 0x9146) {
LAB_0045cb02:
        FString::Format((FString *)this,"%d");
        return (FString)(char *)this;
      }
      copyStr = "high severity";
    }
  }
  else if (severity == 0x9147) {
    copyStr = "medium severity";
  }
  else {
    if (severity != 0x9148) goto LAB_0045cb02;
    copyStr = "low severity";
  }
  FString::operator=((FString *)this,copyStr);
  return (FString)(char *)this;
}

Assistant:

FString FGLDebug::SeverityToString(GLenum severity)
{
	FString s;
	switch (severity)
	{
	case GL_DEBUG_SEVERITY_LOW: s = "low severity"; break;
	case GL_DEBUG_SEVERITY_MEDIUM: s = "medium severity"; break;
	case GL_DEBUG_SEVERITY_HIGH: s = "high severity"; break;
	case GL_DEBUG_SEVERITY_NOTIFICATION: s = "notification"; break;
	default: s.Format("%d", (int)severity);
	}
	return s;
}